

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

void edit_deep_directories(archive_write_disk *a)

{
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  char *local_20;
  char *tail;
  wchar_t ret;
  archive_write_disk *a_local;
  
  local_20 = a->name;
  sVar3 = strlen(local_20);
  if (0x1000 < sVar3) {
    wVar1 = open(".",0x80000);
    a->restore_pwd = wVar1;
    __archive_ensure_cloexec_flag(a->restore_pwd);
    if (L'\xffffffff' < a->restore_pwd) {
      while (sVar3 = strlen(local_20), 0x1000 < sVar3) {
        local_20 = local_20 + 0xff8;
        while( true ) {
          bVar4 = false;
          if (a->name < local_20) {
            bVar4 = *local_20 != '/';
          }
          if (!bVar4) break;
          local_20 = local_20 + -1;
        }
        if (local_20 <= a->name) {
          return;
        }
        *local_20 = '\0';
        tail._4_4_ = create_dir(a,a->name);
        if ((tail._4_4_ == L'\0') && (iVar2 = chdir(a->name), iVar2 != 0)) {
          tail._4_4_ = L'\xffffffe7';
        }
        *local_20 = '/';
        if (tail._4_4_ != L'\0') {
          return;
        }
        local_20 = local_20 + 1;
        a->name = local_20;
      }
    }
  }
  return;
}

Assistant:

static void
edit_deep_directories(struct archive_write_disk *a)
{
	int ret;
	char *tail = a->name;

	/* If path is short, avoid the open() below. */
	if (strlen(tail) <= PATH_MAX)
		return;

	/* Try to record our starting dir. */
	a->restore_pwd = open(".", O_RDONLY | O_BINARY | O_CLOEXEC);
	__archive_ensure_cloexec_flag(a->restore_pwd);
	if (a->restore_pwd < 0)
		return;

	/* As long as the path is too long... */
	while (strlen(tail) > PATH_MAX) {
		/* Locate a dir prefix shorter than PATH_MAX. */
		tail += PATH_MAX - 8;
		while (tail > a->name && *tail != '/')
			tail--;
		/* Exit if we find a too-long path component. */
		if (tail <= a->name)
			return;
		/* Create the intermediate dir and chdir to it. */
		*tail = '\0'; /* Terminate dir portion */
		ret = create_dir(a, a->name);
		if (ret == ARCHIVE_OK && chdir(a->name) != 0)
			ret = ARCHIVE_FAILED;
		*tail = '/'; /* Restore the / we removed. */
		if (ret != ARCHIVE_OK)
			return;
		tail++;
		/* The chdir() succeeded; we've now shortened the path. */
		a->name = tail;
	}
	return;
}